

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nasm_cfg.cpp
# Opt level: O2

NasmCfg * mocker::buildNasmCfg(NasmCfg *__return_storage_ptr__,LineIter funcBeg,LineIter funcEnd)

{
  ulong uVar1;
  _List_const_iterator<mocker::nasm::Line> local_50;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  blockIters;
  LineIter funcEnd_local;
  
  (__return_storage_ptr__->nodes)._M_h._M_buckets =
       &(__return_storage_ptr__->nodes)._M_h._M_single_bucket;
  (__return_storage_ptr__->nodes)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->nodes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->nodes)._M_h._M_element_count = 0;
  (__return_storage_ptr__->nodes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->nodes)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->nodes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  funcEnd_local = funcEnd;
  if (funcBeg._M_node[3]._M_next == (_List_node_base *)0x0) {
    blockIters.
    super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    blockIters.
    super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    blockIters.
    super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; local_50._M_node = funcBeg._M_node, funcBeg._M_node != funcEnd._M_node;
        funcBeg._M_node = (funcBeg._M_node)->_M_next) {
      if (funcBeg._M_node[1]._M_prev != (_List_node_base *)0x0) {
        std::
        vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
        ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>&>
                  ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                    *)&blockIters,&local_50);
        funcBeg._M_node = local_50._M_node;
      }
    }
    std::
    vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
    ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>&>
              ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                *)&blockIters,&funcEnd_local);
    for (uVar1 = 0;
        uVar1 < ((long)blockIters.
                       super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)blockIters.
                       super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U; uVar1 = uVar1 + 1) {
      NasmCfg::addNode(__return_storage_ptr__,
                       blockIters.
                       super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_node,
                       blockIters.
                       super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar1 + 1]._M_node);
    }
    NasmCfg::buildGraph(__return_storage_ptr__);
    std::
    _Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
    ::~_Vector_base(&blockIters.
                     super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                   );
    return __return_storage_ptr__;
  }
  __assert_fail("!funcBeg->inst",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/nasm_cfg.cpp"
                ,0x4e,
                "std::vector<LineIter> mocker::(anonymous namespace)::splitFunctionIntoBlocks(LineIter, LineIter)"
               );
}

Assistant:

NasmCfg buildNasmCfg(LineIter funcBeg, LineIter funcEnd) {
  NasmCfg cfg;

  auto blockIters = splitFunctionIntoBlocks(funcBeg, funcEnd);
  blockIters.emplace_back(funcEnd);
  // add the nodes
  for (std::size_t i = 0; i < blockIters.size() - 1; ++i)
    cfg.addNode(blockIters[i], blockIters[i + 1]);

  cfg.buildGraph();

  return cfg;
}